

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::ConsoleReporter::sectionEnded(ConsoleReporter *this,SectionStats *_sectionStats)

{
  ostream *poVar1;
  long in_RSI;
  long in_RDI;
  Colour colour;
  SectionStats *in_stack_ffffffffffffffb8;
  ConsoleReporter *in_stack_ffffffffffffffc0;
  
  if ((*(byte *)(in_RSI + 0x80) & 1) != 0) {
    lazyPrint(in_stack_ffffffffffffffc0);
    Colour::Colour((Colour *)in_stack_ffffffffffffffc0,
                   (Code)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
    poVar1 = std::operator<<(*(ostream **)(in_RDI + 0x168),"\nNo assertions in section, \'");
    in_stack_ffffffffffffffc0 = (ConsoleReporter *)std::operator<<(poVar1,(string *)(in_RSI + 8));
    in_stack_ffffffffffffffb8 =
         (SectionStats *)std::operator<<((ostream *)in_stack_ffffffffffffffc0,"\'\n");
    std::ostream::operator<<(in_stack_ffffffffffffffb8,std::endl<char,std::char_traits<char>>);
    Colour::~Colour((Colour *)0x1ac52f);
  }
  *(undefined1 *)(in_RDI + 0x188) = 0;
  StreamingReporterBase::sectionEnded
            (&in_stack_ffffffffffffffc0->super_StreamingReporterBase,in_stack_ffffffffffffffb8);
  return;
}

Assistant:

virtual void sectionEnded( SectionStats const& _sectionStats ) {
            if( _sectionStats.missingAssertions ) {
                lazyPrint();
                Colour colour( Colour::ResultError );
                stream << "\nNo assertions in section, '" << _sectionStats.sectionInfo.name << "'\n" << std::endl;
            }
            m_headerPrinted = false;
            StreamingReporterBase::sectionEnded( _sectionStats );
        }